

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O0

void Gia_ManCheckSuppMark_rec(Gia_Man_t *p,Gia_Obj_t *pObj)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  Gia_Obj_t *pObj_local;
  Gia_Man_t *p_local;
  
  if ((*(ulong *)pObj >> 0x1e & 1) == 0) {
    *(ulong *)pObj = *(ulong *)pObj & 0xffffffffbfffffff | 0x40000000;
    iVar1 = Gia_ObjIsCi(pObj);
    if (iVar1 == 0) {
      pGVar2 = Gia_ObjFanin0(pObj);
      Gia_ManCheckSuppMark_rec(p,pGVar2);
      pGVar2 = Gia_ObjFanin1(pObj);
      Gia_ManCheckSuppMark_rec(p,pGVar2);
    }
  }
  return;
}

Assistant:

void Gia_ManCheckSuppMark_rec( Gia_Man_t * p, Gia_Obj_t * pObj )
{
    if ( pObj->fMark0 )
        return;
    pObj->fMark0 = 1;
    if ( Gia_ObjIsCi(pObj) )
        return;
    Gia_ManCheckSuppMark_rec( p, Gia_ObjFanin0(pObj) );
    Gia_ManCheckSuppMark_rec( p, Gia_ObjFanin1(pObj) );
}